

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall asl::Array<asl::InetAddress>::dup(Array<asl::InetAddress> *this,int __fd)

{
  Type *pTVar1;
  InetAddress *in_RAX;
  InetAddress *p;
  Array<asl::InetAddress> b;
  Array<asl::InetAddress> local_18;
  
  p = this->_a;
  if (p[-1]._type != IPv4) {
    local_18._a = in_RAX;
    Array(&local_18,p,*(int *)&p[-1]._data._a);
    if (this->_a != local_18._a) {
      LOCK();
      pTVar1 = &this->_a[-1]._type;
      *pTVar1 = *pTVar1 - IPv4;
      UNLOCK();
      if (*pTVar1 == ANY) {
        free(this,p);
      }
      this->_a = (InetAddress *)local_18;
      LOCK();
      local_18._a[-1]._type = local_18._a[-1]._type + IPv4;
      UNLOCK();
    }
    ~Array(&local_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}